

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void C_MidPrintBold(FFont *font,char *msg)

{
  DBaseStatusBar *this;
  DHUDMessage *this_00;
  
  if (msg != (char *)0x0) {
    FConsoleBuffer::AddText
              (conbuffer,-1,
               "\x1cG\n\x1d\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1f\x1cD\n"
               ,Logfile);
    FConsoleBuffer::AddText(conbuffer,-1,msg,Logfile);
    FConsoleBuffer::AddText
              (conbuffer,-1,
               "\x1cG\n\x1d\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1e\x1f\x1c-\n"
               ,Logfile);
    this = StatusBar;
    this_00 = (DHUDMessage *)
              M_Malloc_Dbg(0xc0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                           ,0x1f9);
    DHUDMessage::DHUDMessage(this_00,font,msg,1.5,0.375,0,0,PrintColors[6],con_midtime.Value);
    DBaseStatusBar::AttachMessage(this,this_00,0x52544e43,0);
    return;
  }
  DBaseStatusBar::DetachMessage(StatusBar,0x52544e43);
  return;
}

Assistant:

void C_MidPrintBold (FFont *font, const char *msg)
{
	if (msg)
	{
		AddToConsole (-1, bar2);
		AddToConsole (-1, msg);
		AddToConsole (-1, bar3);

		StatusBar->AttachMessage (new DHUDMessage (font, msg, 1.5f, 0.375f, 0, 0,
			(EColorRange)PrintColors[PRINTLEVELS+1], con_midtime), MAKE_ID('C','N','T','R'));
	}
	else
	{
		StatusBar->DetachMessage (MAKE_ID('C','N','T','R'));
	}
}